

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkPointFrameGeneric::IntStateScatterReactions
          (ChLinkPointFrameGeneric *this,uint off_L,ChVectorDynamic<> *L)

{
  CoeffReturnType pdVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((this->c_x == true) &&
     ((this->constraint1).super_ChConstraintTwo.super_ChConstraint.active == true)) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L
                       );
    (this->m_react).m_data[0] = *pdVar1;
    iVar2 = 1;
  }
  if ((this->c_y == true) &&
     ((this->constraint2).super_ChConstraintTwo.super_ChConstraint.active == true)) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(iVar2 + off_L));
    iVar2 = iVar2 + 1;
    (this->m_react).m_data[1] = *pdVar1;
  }
  if ((this->c_z == true) &&
     ((this->constraint3).super_ChConstraintTwo.super_ChConstraint.active == true)) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(iVar2 + off_L));
    (this->m_react).m_data[2] = *pdVar1;
  }
  return;
}

Assistant:

void ChLinkPointFrameGeneric::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    int nc = 0;
    if (c_x && this->constraint1.IsActive()) {
        m_react.x() = L(off_L + nc);
        nc++;
    }
    if (c_y && this->constraint2.IsActive()) {
        m_react.y() = L(off_L + nc);
        nc++;
    }
    if (c_z && this->constraint3.IsActive()) {
        m_react.z() = L(off_L + nc);
        // nc++;
    }
}